

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

void dxil_spv::emit_ray_query_capabilities(Impl *impl)

{
  Builder *this;
  Builder *builder;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  spv::Builder::addExtension(this,"SPV_KHR_ray_query");
  spv::Builder::addCapability(this,CapabilityRayQueryKHR);
  spv::Builder::addCapability(this,CapabilityRayTraversalPrimitiveCullingKHR);
  if (((impl->options).opacity_micromap_enabled & 1U) != 0) {
    spv::Builder::addExtension(this,"SPV_EXT_opacity_micromap");
    spv::Builder::addCapability(this,CapabilityRayTracingOpacityMicromapEXT);
  }
  return;
}

Assistant:

static void emit_ray_query_capabilities(Converter::Impl &impl)
{
	auto &builder = impl.builder();
	builder.addExtension("SPV_KHR_ray_query");
	builder.addCapability(spv::CapabilityRayQueryKHR);
	builder.addCapability(spv::CapabilityRayTraversalPrimitiveCullingKHR);
	if (impl.options.opacity_micromap_enabled)
	{
		builder.addExtension("SPV_EXT_opacity_micromap");
		builder.addCapability(spv::CapabilityRayTracingOpacityMicromapEXT);
	}
}